

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O2

ktx_uint32_t ktxTexture2_GetNumComponents(ktxTexture2 *This)

{
  byte bVar1;
  uint32_t *DFD;
  byte bVar2;
  uint32_t uVar3;
  uint uVar4;
  char cVar5;
  
  DFD = This->pDfd;
  uVar3 = getDFDNumComponents(DFD);
  cVar5 = (char)DFD[3];
  if (cVar5 < '\0') {
    if (cVar5 == -0x5a) {
      uVar4 = *(byte *)((long)DFD + 0x1f) & 0xf;
      if ((5 < uVar4) || ((0x39U >> uVar4 & 1) == 0)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                      ,0x735,"ktx_uint32_t ktxTexture2_GetNumComponents(ktxTexture2 *)");
      }
      uVar3 = *(uint32_t *)(&DAT_00262b40 + (ulong)uVar4 * 4);
    }
    else if ((DFD[3] & 0xff) == 0xa3) {
      bVar1 = *(byte *)((long)DFD + 0x1f);
      if (uVar3 == 1) {
        uVar3 = (uint)((bVar1 & 0xf) == 0) * 2 + 1;
      }
      else {
        bVar2 = *(byte *)((long)DFD + 0x2f) & 0xf;
        if (bVar2 == 0xf && (bVar1 & 0xf) == 0) {
          uVar3 = 4;
        }
        else {
          if (((bVar1 & 0xf) != 3) || (bVar2 != 4)) {
            __assert_fail("channel0Id == KHR_DF_CHANNEL_ETC1S_RRR && channel1Id == KHR_DF_CHANNEL_ETC1S_GGG"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                          ,0x723,"ktx_uint32_t ktxTexture2_GetNumComponents(ktxTexture2 *)");
          }
          uVar3 = 2;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

ktx_uint32_t
ktxTexture2_GetNumComponents(ktxTexture2* This)
{
    uint32_t* pBdb = This->pDfd + 1;
    uint32_t dfdNumComponents = getDFDNumComponents(This->pDfd);
    uint32_t colorModel = KHR_DFDVAL(pBdb, MODEL);
    if (colorModel < KHR_DF_MODEL_DXT1A) {
        return dfdNumComponents;
    } else {
        switch (colorModel) {
          case KHR_DF_MODEL_ETC1S:
          {
            uint32_t channel0Id = KHR_DFDSVAL(pBdb, 0, CHANNELID);
            if (dfdNumComponents == 1) {
                if (channel0Id == KHR_DF_CHANNEL_ETC1S_RGB)
                    return 3;
                else
                    return 1;
            } else {
                uint32_t channel1Id = KHR_DFDSVAL(pBdb, 1, CHANNELID);
                if (channel0Id == KHR_DF_CHANNEL_ETC1S_RGB
                    && channel1Id == KHR_DF_CHANNEL_ETC1S_AAA)
                    return 4;
                else {
                    // An invalid combination of channel Ids should never
                    // have been set during creation or should have been
                    // caught when the file was loaded.
                    assert(channel0Id == KHR_DF_CHANNEL_ETC1S_RRR
                           && channel1Id == KHR_DF_CHANNEL_ETC1S_GGG);
                    return 2;
                }
            }
            break;
          }
          case KHR_DF_MODEL_UASTC:
            switch (KHR_DFDSVAL(pBdb, 0, CHANNELID)) {
              case KHR_DF_CHANNEL_UASTC_RRR:
                return 1;
              case KHR_DF_CHANNEL_UASTC_RRRG:
                return 2;
              case KHR_DF_CHANNEL_UASTC_RGB:
                return 3;
              case KHR_DF_CHANNEL_UASTC_RGBA:
                return 4;
              default:
                // Same comment as for the assert in the ETC1 case.
                assert(false);
                return 1;
            }
            break;
          default:
            return dfdNumComponents;
        }
    }
}